

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

void hash(void *key,size_t len,uint32_t seed,size_t *r_hash)

{
  uint64_t *in_stack_00000040;
  uint32_t in_stack_00000048;
  int in_stack_0000004c;
  void *in_stack_00000050;
  
  hash_x64_128(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000040);
  return;
}

Assistant:

static inline void
hash(const void *key, size_t len, const uint32_t seed, size_t r_hash[2]) {
	assert(len <= INT_MAX); /* Unfortunate implementation limitation. */

#if (LG_SIZEOF_PTR == 3 && !defined(JEMALLOC_BIG_ENDIAN))
	hash_x64_128(key, (int)len, seed, (uint64_t *)r_hash);
#else
	{
		uint64_t hashes[2];
		hash_x86_128(key, (int)len, seed, hashes);
		r_hash[0] = (size_t)hashes[0];
		r_hash[1] = (size_t)hashes[1];
	}
#endif
}